

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorCase::iterate(ScissorCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar10;
  undefined4 extraout_var;
  TestLog *this_00;
  undefined4 extraout_var_00;
  PixelFormat *pPVar12;
  undefined4 extraout_var_01;
  char *str;
  MessageBuilder *pMVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Vector<float,_4> VVar18;
  ConstPixelBufferAccess local_b10;
  ConstPixelBufferAccess local_ae8;
  Vector<int,_4> local_ac0;
  PixelBufferAccess local_ab0;
  MessageBuilder local_a88;
  PixelBufferAccess local_908;
  Vector<int,_4> local_8e0;
  MessageBuilder local_8d0;
  PixelBufferAccess local_750;
  Vector<int,_4> local_728;
  MessageBuilder local_718;
  MessageBuilder local_598;
  Vector<int,_4> local_418;
  MessageBuilder local_408;
  undefined4 local_284;
  undefined1 local_280 [8];
  Surface resImage;
  Surface refImage;
  IVec4 absScissorArea;
  IVec4 relScissorArea;
  RandomViewport viewport;
  ProgramSources local_208;
  undefined1 local_138 [8];
  ShaderProgram shader;
  Vector<float,_4> local_58;
  undefined1 local_48 [8];
  Vec4 threshold;
  PixelFormat renderFormat;
  TestLog *log;
  Functions *gl;
  ScissorCase *this_local;
  long lVar11;
  
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar6);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar12 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_00,iVar6));
  threshold.m_data[2] = (float)pPVar12->redBits;
  threshold.m_data[3] = (float)pPVar12->greenBits;
  uVar3 = pPVar12->blueBits;
  uVar4 = pPVar12->alphaBits;
  iVar6 = de::max<int>(0,8 - (int)threshold.m_data[2]);
  iVar7 = de::max<int>(0,8 - (int)threshold.m_data[3]);
  iVar8 = de::max<int>(0,8 - uVar3);
  iVar9 = de::max<int>(0,8 - uVar4);
  tcu::Vector<unsigned_int,_4>::Vector
            ((Vector<unsigned_int,_4> *)&shader.m_program.m_info.linkTimeUs,
             1 << ((byte)iVar6 & 0x1f),1 << ((byte)iVar7 & 0x1f),1 << ((byte)iVar8 & 0x1f),
             1 << ((byte)iVar9 & 0x1f));
  tcu::Vector<unsigned_int,_4>::asFloat((Vector<unsigned_int,_4> *)&local_58);
  VVar18 = tcu::operator*((tcu *)local_48,0.02,&local_58);
  pRVar1 = this->m_renderCtx;
  type.super_ApiType.m_bits =
       (ApiType)(*pRVar1->_vptr_RenderContext[2])(VVar18.m_data[0],VVar18.m_data._8_8_);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders(&local_208,version);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_138,pRVar1,&local_208);
  glu::ProgramSources::~ProgramSources(&local_208);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar10 = deStringHash(str);
  TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)(relScissorArea.m_data + 2),
             (RenderTarget *)CONCAT44(extraout_var_01,iVar6),0x100,0x100,dVar10);
  fVar14 = tcu::Vector<float,_4>::x(&this->m_scissorArea);
  fVar15 = tcu::Vector<float,_4>::y(&this->m_scissorArea);
  fVar16 = tcu::Vector<float,_4>::z(&this->m_scissorArea);
  fVar17 = tcu::Vector<float,_4>::w(&this->m_scissorArea);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)(absScissorArea.m_data + 2),(int)(fVar14 * (float)viewport.x),
             (int)(fVar15 * (float)viewport.y),(int)(fVar16 * (float)viewport.x),
             (int)(fVar17 * (float)viewport.y));
  iVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(absScissorArea.m_data + 2));
  iVar6 = iVar6 + relScissorArea.m_data[2];
  iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(absScissorArea.m_data + 2));
  iVar7 = iVar7 + relScissorArea.m_data[3];
  iVar8 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(absScissorArea.m_data + 2));
  iVar9 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(absScissorArea.m_data + 2));
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)((long)&refImage.m_pixels.m_cap + 4),iVar6,iVar7,iVar8,iVar9);
  tcu::Surface::Surface((Surface *)&resImage.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_280,viewport.x,viewport.y);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_138);
  if (bVar5) {
    tcu::TestLog::operator<<(&local_408,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<(&local_408,(char (*) [18])"Viewport area is ");
    tcu::Vector<int,_4>::Vector
              (&local_418,relScissorArea.m_data[2],relScissorArea.m_data[3],viewport.x,viewport.y);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_418);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_408);
    tcu::TestLog::operator<<(&local_598,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<(&local_598,(char (*) [17])"Scissor area is ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        (pMVar13,(Vector<int,_4> *)((long)&refImage.m_pixels.m_cap + 4));
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_598);
    tcu::TestLog::operator<<(&local_718,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        (&local_718,(char (*) [40])"Rendering reference (scissors disabled)");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_718);
    pcVar2 = *(code **)(lVar11 + 0x1680);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
    (*pcVar2)(dVar10);
    (**(code **)(lVar11 + 0x1a00))
              (relScissorArea.m_data[2],relScissorArea.m_data[3],viewport.x,viewport.y);
    (**(code **)(lVar11 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
    (**(code **)(lVar11 + 0x1d0))(0x3f800000);
    (**(code **)(lVar11 + 0x208))(0);
    (**(code **)(lVar11 + 0x4e8))(0xb71);
    (**(code **)(lVar11 + 0x4e8))(0xb90);
    (**(code **)(lVar11 + 0x4e8))(0xc11);
    (**(code **)(lVar11 + 0x188))(0x4500);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
    tcu::Vector<int,_4>::Vector
              (&local_728,relScissorArea.m_data[2],relScissorArea.m_data[3],viewport.x,viewport.y);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,(ulong)dVar10,&local_728);
    iVar7 = relScissorArea.m_data[3];
    iVar6 = relScissorArea.m_data[2];
    pRVar1 = this->m_renderCtx;
    tcu::Surface::getAccess(&local_750,(Surface *)&resImage.m_pixels.m_cap);
    glu::readPixels(pRVar1,iVar6,iVar7,&local_750);
    dVar10 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar10,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0xf5);
    tcu::TestLog::operator<<(&local_8d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        (&local_8d0,(char (*) [36])"Rendering result (scissors enabled)");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_8d0);
    pcVar2 = *(code **)(lVar11 + 0x1680);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
    (*pcVar2)(dVar10);
    (**(code **)(lVar11 + 0x1a00))
              (relScissorArea.m_data[2],relScissorArea.m_data[3],viewport.x,viewport.y);
    (**(code **)(lVar11 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
    (**(code **)(lVar11 + 0x1d0))(0x3f800000);
    (**(code **)(lVar11 + 0x208))(0);
    (**(code **)(lVar11 + 0x4e8))(0xb71);
    (**(code **)(lVar11 + 0x4e8))(0xb90);
    (**(code **)(lVar11 + 0x4e8))(0xc11);
    (**(code **)(lVar11 + 0x188))(0x4500);
    pcVar2 = *(code **)(lVar11 + 0x1290);
    iVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)((long)&refImage.m_pixels.m_cap + 4));
    iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)((long)&refImage.m_pixels.m_cap + 4));
    iVar8 = tcu::Vector<int,_4>::z((Vector<int,_4> *)((long)&refImage.m_pixels.m_cap + 4));
    iVar9 = tcu::Vector<int,_4>::w((Vector<int,_4> *)((long)&refImage.m_pixels.m_cap + 4));
    (*pcVar2)(iVar6,iVar7,iVar8,iVar9);
    (**(code **)(lVar11 + 0x5e0))(0xc11);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
    tcu::Vector<int,_4>::Vector
              (&local_8e0,relScissorArea.m_data[2],relScissorArea.m_data[3],viewport.x,viewport.y);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,(ulong)dVar10,&local_8e0);
    pRVar1 = this->m_renderCtx;
    tcu::Surface::getAccess(&local_908,(Surface *)local_280);
    glu::readPixels(pRVar1,relScissorArea.m_data[2],relScissorArea.m_data[3],&local_908);
    dVar10 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar10,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x10d);
    tcu::TestLog::operator<<(&local_a88,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        (&local_a88,
                         (char (*) [50])"Clearing area outside scissor area from reference");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a88);
    tcu::Surface::getAccess(&local_ab0,(Surface *)&resImage.m_pixels.m_cap);
    tcu::Vector<int,_4>::Vector(&local_ac0,0x20,0x40,0x80,0xff);
    Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
              (&local_ab0,&local_ac0,(IVec4 *)(absScissorArea.m_data + 2));
    tcu::Surface::getAccess((PixelBufferAccess *)&local_ae8,(Surface *)&resImage.m_pixels.m_cap);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_b10,(Surface *)local_280);
    bVar5 = tcu::floatThresholdCompare
                      (this_00,"ComparisonResult","Image comparison result",&local_ae8,&local_b10,
                       (Vec4 *)local_48,COMPARE_LOG_RESULT);
    if (bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
    }
  }
  else {
    glu::operator<<(this_00,(ShaderProgram *)local_138);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader compile/link failed");
  }
  local_284 = 1;
  tcu::Surface::~Surface((Surface *)local_280);
  tcu::Surface::~Surface((Surface *)&resImage.m_pixels.m_cap);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_138);
  return STOP;
}

Assistant:

ScissorCase::IterateResult ScissorCase::iterate (void)
{
	using TextureTestUtil::RandomViewport;

	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	TestLog&					log				= m_testCtx.getLog();
	const tcu::PixelFormat		renderFormat	= m_renderCtx.getRenderTarget().getPixelFormat();
	const tcu::Vec4				threshold		= 0.02f * UVec4(1u << de::max(0, 8 - renderFormat.redBits),
																1u << de::max(0, 8 - renderFormat.greenBits),
																1u << de::max(0, 8 - renderFormat.blueBits),
																1u << de::max(0, 8 - renderFormat.alphaBits)).asFloat();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const RandomViewport		viewport		(m_renderCtx.getRenderTarget(), 256, 256, deStringHash(getName()));
	const IVec4					relScissorArea	(int(m_scissorArea.x() * (float)viewport.width),
												 int(m_scissorArea.y() * (float)viewport.height),
												 int(m_scissorArea.z() * (float)viewport.width),
												 int(m_scissorArea.w() * (float)viewport.height));
	const IVec4					absScissorArea	(relScissorArea.x() + viewport.x,
												 relScissorArea.y() + viewport.y,
												 relScissorArea.z(),
												 relScissorArea.w());

	tcu::Surface				refImage		(viewport.width, viewport.height);
	tcu::Surface				resImage		(viewport.width, viewport.height);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	log << TestLog::Message << "Viewport area is " << IVec4(viewport.x, viewport.y, viewport.width, viewport.height) << TestLog::EndMessage;
	log << TestLog::Message << "Scissor area is " << absScissorArea << TestLog::EndMessage;

	// Render reference (no scissors)
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, refImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result (scissors)
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		gl.scissor(absScissorArea.x(), absScissorArea.y(), absScissorArea.z(), absScissorArea.w());
		gl.enable(GL_SCISSOR_TEST);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Manual 'scissors' for reference image
	log << TestLog::Message << "Clearing area outside scissor area from reference" << TestLog::EndMessage;
	clearEdges(refImage.getAccess(), IVec4(32, 64, 128, 255), relScissorArea);

	if (tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refImage.getAccess(), resImage.getAccess(), threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}